

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console_reporter.cc
# Opt level: O2

bool __thiscall benchmark::ConsoleReporter::ReportContext(ConsoleReporter *this,Context *context)

{
  char *pcVar1;
  int iVar2;
  ostream *poVar3;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  this->name_field_width_ = context->name_field_width;
  poVar3 = std::operator<<((ostream *)&std::cerr,"Run on (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,context->num_cpus);
  std::operator<<(poVar3," X ");
  poVar3 = std::ostream::_M_insert<double>(context->mhz_per_cpu);
  poVar3 = std::operator<<(poVar3," MHz CPU ");
  pcVar1 = ".[\\*^$\n";
  if (1 < context->num_cpus) {
    pcVar1 = "\"%s\": %s";
  }
  poVar3 = std::operator<<(poVar3,pcVar1 + 7);
  std::operator<<(poVar3,")\n");
  LocalDateTimeString_abi_cxx11_();
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)local_40);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)local_40);
  if (context->cpu_scaling_enabled == true) {
    std::operator<<((ostream *)&std::cerr,
                    "***WARNING*** CPU scaling is enabled, the benchmark real time measurements may be noisy and will incure extra overhead.\n"
                   );
  }
  std::operator<<((ostream *)&std::cerr,
                  "***WARNING*** Library was built as DEBUG. Timings may be affected.\n");
  iVar2 = fprintf(_stdout,"%-*s %10s %10s %10s\n",(ulong)(uint)this->name_field_width_,"Benchmark",
                  "Time(ns)","CPU(ns)","Iterations");
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct((ulong)local_40,(char)iVar2 + -1);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)local_40);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)local_40);
  return true;
}

Assistant:

bool ConsoleReporter::ReportContext(const Context& context) {
  name_field_width_ = context.name_field_width;

  std::cerr << "Run on (" << context.num_cpus << " X " << context.mhz_per_cpu
            << " MHz CPU " << ((context.num_cpus > 1) ? "s" : "") << ")\n";

  std::cerr << LocalDateTimeString() << "\n";

  if (context.cpu_scaling_enabled) {
    std::cerr << "***WARNING*** CPU scaling is enabled, the benchmark "
                 "real time measurements may be noisy and will incure extra "
                 "overhead.\n";
  }

#ifndef NDEBUG
  std::cerr << "***WARNING*** Library was built as DEBUG. Timings may be "
               "affected.\n";
#endif

  int output_width = fprintf(stdout, "%-*s %10s %10s %10s\n",
                             static_cast<int>(name_field_width_), "Benchmark",
                             "Time(ns)", "CPU(ns)", "Iterations");
  std::cout << std::string(output_width - 1, '-') << "\n";

  return true;
}